

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
::increment_slow(btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                 *this)

{
  int iVar1;
  uint uVar2;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar7;
  template_ElementType<3L> this_00;
  template_ElementType<3L> *ppbVar8;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  save;
  int iStack_20;
  
  bVar5 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::leaf(this->node);
  iVar1 = this->position;
  bVar6 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::count(this->node);
  if (bVar5) {
    if (iVar1 < (int)(uint)bVar6) {
      __assert_fail("position >= node->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x6ec,
                    "void gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, int &, int *>::increment_slow() [Node = gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, Reference = int &, Pointer = int *]"
                   );
    }
    pbVar3 = this->node;
    uVar4 = *(undefined8 *)&this->position;
    pbVar7 = this->node;
    while( true ) {
      uVar2 = this->position;
      bVar6 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::count(pbVar7);
      if (uVar2 != bVar6) break;
      bVar5 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::is_root(this->node);
      if (bVar5) break;
      pbVar7 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
               ::parent(this->node);
      bVar6 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::position(this->node);
      pbVar7 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
               ::child(pbVar7,(uint)bVar6);
      if (pbVar7 != this->node) {
        __assert_fail("node->parent()->child(node->position()) == node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x6ef,
                      "void gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, int &, int *>::increment_slow() [Node = gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, Reference = int &, Pointer = int *]"
                     );
      }
      bVar6 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::position(this->node);
      this->position = (uint)bVar6;
      pbVar7 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
               ::parent(this->node);
      this->node = pbVar7;
    }
    uVar2 = this->position;
    bVar6 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::count(this->node);
    if (uVar2 == bVar6) {
      iStack_20 = (int)uVar4;
      this->position = iStack_20;
      this->node = pbVar3;
    }
  }
  else {
    if ((int)(uint)bVar6 <= iVar1) {
      __assert_fail("position < node->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x6f7,
                    "void gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, int &, int *>::increment_slow() [Node = gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, Reference = int &, Pointer = int *]"
                   );
    }
    this_00 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::child(this->node,this->position + 1);
    while( true ) {
      this->node = this_00;
      bVar5 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::leaf(this_00);
      if (bVar5) break;
      ppbVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                ::GetField<3l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                *)this->node);
      this_00 = *ppbVar8;
    }
    this->position = 0;
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
  if (node->leaf()) {
    assert(position >= node->count());
    btree_iterator save(*this);
    while (position == node->count() && !node->is_root()) {
      assert(node->parent()->child(node->position()) == node);
      position = node->position();
      node = node->parent();
    }
    if (position == node->count()) {
      *this = save;
    }
  } else {
    assert(position < node->count());
    node = node->child(position + 1);
    while (!node->leaf()) {
      node = node->child(0);
    }
    position = 0;
  }
}